

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::WindowDataParameter::Clear(WindowDataParameter *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value;
  string **ppsVar2;
  string *psVar3;
  LogMessage *pLVar4;
  LogFinisher local_16a;
  byte local_169;
  LogMessage local_168;
  LogFinisher local_12a;
  byte local_129;
  LogMessage local_128;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_ad [20];
  byte local_99;
  LogMessage local_98;
  WindowDataParameter *local_60;
  WindowDataParameter *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_60 = this;
  if ((local_18->has_bits_[0] & 0xf) != 0) {
    bVar1 = has_source(this);
    if (bVar1) {
      psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->source_,psVar3);
      local_99 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97c1);
        local_99 = 1;
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           (&local_98,
                            "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_ad,pLVar4);
      }
      if ((local_99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_98);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->source_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_mean_file(this);
    if (bVar1) {
      psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->mean_file_,psVar3);
      local_e9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97c5);
        local_e9 = 1;
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           (&local_e8,
                            "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_ea,pLVar4);
      }
      if ((local_e9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_e8);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->mean_file_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_crop_mode(this);
    if (bVar1) {
      default_value =
           google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_crop_mode__abi_cxx11_);
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->crop_mode_,default_value)
      ;
      local_129 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_128,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97c9);
        local_129 = 1;
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           (&local_128,
                            "CHECK failed: !crop_mode_.IsDefault(&WindowDataParameter::_default_crop_mode_.get()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_12a,pLVar4);
      }
      if ((local_129 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_128);
      }
      ppsVar2 = google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                          (&this->crop_mode_);
      psVar3 = *ppsVar2;
      google::protobuf::internal::
      ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)_default_crop_mode__abi_cxx11_);
      std::__cxx11::string::assign((string *)psVar3);
    }
    bVar1 = has_root_folder(this);
    if (bVar1) {
      psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->root_folder_,psVar3);
      local_169 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_168,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x97cd);
        local_169 = 1;
        pLVar4 = google::protobuf::internal::LogMessage::operator<<
                           (&local_168,
                            "CHECK failed: !root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_16a,pLVar4);
      }
      if ((local_169 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_168);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->root_folder_);
      std::__cxx11::string::clear();
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xf0) != 0) {
    memset(&this->batch_size_,0,10);
  }
  local_38 = &this->_has_bits_;
  local_3c = 0;
  if ((local_38->has_bits_[0] & 0x1f00) != 0) {
    this->context_pad_ = 0;
    this->scale_ = 1.0;
    this->fg_threshold_ = 0.5;
    this->bg_threshold_ = 0.5;
    this->fg_fraction_ = 0.25;
  }
  this_local = (WindowDataParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_50 = &this->_internal_metadata_;
  if (((uint)(local_50->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_48 = local_50;
    local_10 = local_50;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_50);
  }
  return;
}

Assistant:

void WindowDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.WindowDataParameter)
  if (_has_bits_[0 / 32] & 15u) {
    if (has_source()) {
      GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*source_.UnsafeRawStringPointer())->clear();
    }
    if (has_mean_file()) {
      GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*mean_file_.UnsafeRawStringPointer())->clear();
    }
    if (has_crop_mode()) {
      GOOGLE_DCHECK(!crop_mode_.IsDefault(&WindowDataParameter::_default_crop_mode_.get()));
      (*crop_mode_.UnsafeRawStringPointer())->assign(*&WindowDataParameter::_default_crop_mode_.get());
    }
    if (has_root_folder()) {
      GOOGLE_DCHECK(!root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*root_folder_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 240u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&cache_images_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(cache_images_));
  }
  if (_has_bits_[8 / 32] & 7936u) {
    context_pad_ = 0u;
    scale_ = 1;
    fg_threshold_ = 0.5f;
    bg_threshold_ = 0.5f;
    fg_fraction_ = 0.25f;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}